

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::MemPass::IsTargetType(MemPass *this,Instruction *typeInst)

{
  bool bVar1;
  uint32_t id;
  MemPass *this_00;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this_00 = this;
  while( true ) {
    bVar1 = IsBaseTargetType(this_00,typeInst);
    if (bVar1) {
      return bVar1;
    }
    if (typeInst->opcode_ != OpTypeArray) break;
    this_00 = (MemPass *)Pass::get_def_use_mgr(&this->super_Pass);
    id = Instruction::GetSingleWordOperand(typeInst,1);
    typeInst = analysis::DefUseManager::GetDef((DefUseManager *)this_00,id);
  }
  if (typeInst->opcode_ != OpTypeStruct) {
    return bVar1;
  }
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:66:34)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:66:34)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  bVar1 = Instruction::WhileEachInId(typeInst,(function<bool_(const_unsigned_int_*)> *)&local_48);
  if (local_38 == (code *)0x0) {
    return bVar1;
  }
  (*local_38)(&local_48,&local_48,__destroy_functor);
  return bVar1;
}

Assistant:

bool MemPass::IsTargetType(const Instruction* typeInst) const {
  if (IsBaseTargetType(typeInst)) return true;
  if (typeInst->opcode() == spv::Op::OpTypeArray) {
    if (!IsTargetType(
            get_def_use_mgr()->GetDef(typeInst->GetSingleWordOperand(1)))) {
      return false;
    }
    return true;
  }
  if (typeInst->opcode() != spv::Op::OpTypeStruct) return false;
  // All struct members must be math type
  return typeInst->WhileEachInId([this](const uint32_t* tid) {
    Instruction* compTypeInst = get_def_use_mgr()->GetDef(*tid);
    if (!IsTargetType(compTypeInst)) return false;
    return true;
  });
}